

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::queryState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,
               QueriedState *state)

{
  GLboolean v;
  bool bVar1;
  StateQueryMemoryWriteGuard<unsigned_char> value;
  undefined1 local_38 [4];
  float fStack_34;
  void *pvStack_30;
  long local_28;
  
  switch(type) {
  case QUERY_BOOLEAN:
    _local_38 = CONCAT53(stack0xffffffffffffffcb,0xdedede);
    glu::CallLogWrapper::glGetBooleanv(gl,target,local_38 + 1);
    bVar1 = checkError(result,gl,"glGetBooleanv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_char> *)local_38,result);
    if (!bVar1) {
      return;
    }
    bVar1 = verifyBooleanValidity(result,local_38[1]);
    if (!bVar1) {
      return;
    }
    v = local_38[1];
    goto LAB_00494061;
  case QUERY_ISENABLED:
    v = glu::CallLogWrapper::glIsEnabled(gl,target);
    bVar1 = checkError(result,gl,"glIsEnabled");
    if (!bVar1) {
      return;
    }
    bVar1 = verifyBooleanValidity(result,v);
    if (!bVar1) {
      return;
    }
LAB_00494061:
    state->m_type = DATATYPE_BOOLEAN;
    (state->m_v).vBool = v == '\x01';
    break;
  case QUERY_INTEGER:
    _local_38 = -0x2121212121212122;
    pvStack_30 = (void *)CONCAT44(pvStack_30._4_4_,0xdededede);
    glu::CallLogWrapper::glGetIntegerv(gl,target,(GLint *)(local_38 + 4));
    bVar1 = checkError(result,gl,"glGetIntegerv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_38,result), bVar1)) {
      state->m_type = DATATYPE_INTEGER;
      (state->m_v).vInt = (GLint)fStack_34;
    }
    break;
  case QUERY_INTEGER64:
    local_28 = -0x2121212121212122;
    _local_38 = -0x2121212121212122;
    pvStack_30 = (void *)0xdededededededede;
    glu::CallLogWrapper::glGetInteger64v(gl,target,(GLint64 *)&pvStack_30);
    bVar1 = checkError(result,gl,"glGetInteger64v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<long>::verifyValidity
                          ((StateQueryMemoryWriteGuard<long> *)local_38,result), bVar1)) {
      state->m_type = DATATYPE_INTEGER64;
      (state->m_v).vPtr = pvStack_30;
    }
    break;
  case QUERY_FLOAT:
    _local_38 = -0x2121212121212122;
    pvStack_30 = (void *)CONCAT44(pvStack_30._4_4_,0xdededede);
    glu::CallLogWrapper::glGetFloatv(gl,target,(GLfloat *)(local_38 + 4));
    bVar1 = checkError(result,gl,"glGetFloatv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity
                          ((StateQueryMemoryWriteGuard<float> *)local_38,result), bVar1)) {
      state->m_type = DATATYPE_FLOAT;
      (state->m_v).vInt = (GLint)fStack_34;
    }
  }
  return;
}

Assistant:

void queryState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, QueriedState& state)
{
	switch (type)
	{
		case QUERY_ISENABLED:
		{
			const glw::GLboolean value = gl.glIsEnabled(target);

			if (!checkError(result, gl, "glIsEnabled"))
				return;

			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_BOOLEAN:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean> value;
			gl.glGetBooleanv(target, &value);

			if (!checkError(result, gl, "glGetBooleanv"))
				return;

			if (!value.verifyValidity(result))
				return;
			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetIntegerv(target, &value);

			if (!checkError(result, gl, "glGetIntegerv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INTEGER64:
		{
			StateQueryMemoryWriteGuard<glw::GLint64> value;
			gl.glGetInteger64v(target, &value);

			if (!checkError(result, gl, "glGetInteger64v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetFloatv(target, &value);

			if (!checkError(result, gl, "glGetFloatv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}